

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::CumulativeReporterBase::assertionEnded
          (CumulativeReporterBase *this,AssertionStats *assertionStats)

{
  string local_58;
  string local_38;
  
  if (((this->m_shouldStoreFailedAssertions == true) &&
      (((assertionStats->assertionResult).m_resultData.resultType & FailureBit) != Ok)) &&
     (((assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) == 0)) {
    AssertionResult::getExpandedExpression_abi_cxx11_(&local_38,&assertionStats->assertionResult);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_shouldStoreSuccesfulAssertions == true) &&
     ((((assertionStats->assertionResult).m_resultData.resultType & FailureBit) == Ok ||
      (((assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)))) {
    AssertionResult::getExpandedExpression_abi_cxx11_(&local_58,&assertionStats->assertionResult);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<Catch::Detail::AssertionOrBenchmarkResult,std::allocator<Catch::Detail::AssertionOrBenchmarkResult>>
  ::emplace_back<Catch::AssertionStats_const&>
            ((vector<Catch::Detail::AssertionOrBenchmarkResult,std::allocator<Catch::Detail::AssertionOrBenchmarkResult>>
              *)&(this->m_sectionStack).
                 super__Vector_base<Catch::CumulativeReporterBase::SectionNode_*,_std::allocator<Catch::CumulativeReporterBase::SectionNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1]->assertionsAndBenchmarks,
             assertionStats);
  return;
}

Assistant:

void CumulativeReporterBase::assertionEnded(
        AssertionStats const& assertionStats ) {
        assert( !m_sectionStack.empty() );
        // AssertionResult holds a pointer to a temporary DecomposedExpression,
        // which getExpandedExpression() calls to build the expression string.
        // Our section stack copy of the assertionResult will likely outlive the
        // temporary, so it must be expanded or discarded now to avoid calling
        // a destroyed object later.
        if ( m_shouldStoreFailedAssertions &&
             !assertionStats.assertionResult.isOk() ) {
            static_cast<void>(
                assertionStats.assertionResult.getExpandedExpression() );
        }
        if ( m_shouldStoreSuccesfulAssertions &&
             assertionStats.assertionResult.isOk() ) {
            static_cast<void>(
                assertionStats.assertionResult.getExpandedExpression() );
        }
        SectionNode& sectionNode = *m_sectionStack.back();
        sectionNode.assertionsAndBenchmarks.emplace_back( assertionStats );
    }